

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_key_helpers.hpp
# Opt level: O3

void duckdb::AggregateSortKeyHelpers::
     UnaryUpdate<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::QuantileListFallback,(duckdb::OrderType)2,true>
               (Vector *inputs,AggregateInputData *input_data,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  string_t element;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat kdata;
  UnifiedVectorFormat idata;
  Vector sort_key;
  LogicalType local_180 [24];
  long *local_168;
  long local_160;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  long *local_120;
  long local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  long *local_d8 [2];
  long local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  Vector local_90 [8];
  LogicalType local_88 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  duckdb::LogicalType::LogicalType(local_180,BLOB);
  duckdb::Vector::Vector(local_90,local_180,0x800);
  duckdb::LogicalType::~LogicalType(local_180);
  duckdb::CreateSortKeyHelpers::CreateSortKey(inputs,count,(OrderModifiers)0x302,local_90);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_d8);
  duckdb::Vector::ToUnifiedFormat((ulong)inputs,(UnifiedVectorFormat *)count);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_120);
  duckdb::Vector::ToUnifiedFormat((ulong)local_90,(UnifiedVectorFormat *)count);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_168);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  if (count != 0) {
    uVar3 = 0;
    do {
      uVar1 = uVar3;
      if (*local_168 != 0) {
        uVar1 = (ulong)*(uint *)(*local_168 + uVar3 * 4);
      }
      uVar2 = uVar3;
      if (*local_d8[0] != 0) {
        uVar2 = (ulong)*(uint *)(*local_d8[0] + uVar3 * 4);
      }
      if ((local_c8 == 0) || ((*(ulong *)(local_c8 + (uVar2 >> 6) * 8) >> (uVar2 & 0x3f) & 1) != 0))
      {
        uVar2 = uVar3;
        if (*local_120 != 0) {
          uVar2 = (ulong)*(uint *)(*local_120 + uVar3 * 4);
        }
        element.value.pointer.ptr = (char *)*(undefined8 *)(local_118 + 8 + uVar2 * 0x10);
        element.value._0_8_ = *(undefined8 *)(local_118 + uVar2 * 0x10);
        QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                  (*(QuantileState<duckdb::string_t,_duckdb::QuantileStringType> **)
                    (local_160 + uVar1 * 8),element,input_data);
      }
      uVar3 = uVar3 + 1;
    } while (count != uVar3);
  }
  if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
  }
  if (local_148 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_148);
  }
  if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
  }
  if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  duckdb::LogicalType::~LogicalType(local_88);
  return;
}

Assistant:

static void UnaryUpdate(Vector inputs[], AggregateInputData &input_data, idx_t input_count, Vector &state_vector,
	                        idx_t count) {
		D_ASSERT(input_count == 1);
		auto &input = inputs[0];

		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		CreateSortKeyHelpers::CreateSortKey(input, count, modifiers, sort_key);

		UnifiedVectorFormat idata;
		if (IGNORE_NULLS) {
			input.ToUnifiedFormat(count, idata);
		}

		UnifiedVectorFormat kdata;
		sort_key.ToUnifiedFormat(count, kdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		auto key_data = UnifiedVectorFormat::GetData<string_t>(kdata);
		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto sidx = sdata.sel->get_index(i);
			if (IGNORE_NULLS) {
				auto idx = idata.sel->get_index(i);
				if (!idata.validity.RowIsValid(idx)) {
					continue;
				}
			}
			const auto key_idx = kdata.sel->get_index(i);
			auto &state = *states[sidx];
			OP::template Execute<string_t, STATE, OP>(state, key_data[key_idx], input_data);
		}
	}